

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

TRef find_kinit(jit_State *J,BCIns *endpc,BCReg slot,IRType t)

{
  GCproto *pGVar1;
  uint uVar2;
  GCproto *pGVar3;
  GCproto *pGVar4;
  GCproto *pGVar5;
  TRef TVar6;
  ulong uVar7;
  long lVar8;
  int k;
  MRef *pMVar9;
  uint uVar10;
  double dVar11;
  
  pGVar1 = J->pt + 1;
  pGVar5 = (GCproto *)(endpc + -1);
  pGVar4 = (GCproto *)endpc;
  do {
    pGVar3 = pGVar5;
    if (pGVar3 <= pGVar1) {
      return 0;
    }
    uVar2 = pGVar4[-1].varinfo.ptr32;
    uVar10 = uVar2 & 0xff;
    if ((lj_bc_mode[uVar10] & 7) == 1) {
      if ((uVar2 >> 8 & 0xff) == slot) {
        if (1 < uVar10 - 0x29) {
          return 0;
        }
        pMVar9 = &pGVar4[-1].varinfo;
        if (pGVar1 < pMVar9) {
          lVar8 = -0x20004;
          do {
            if ((((char)pMVar9->ptr32 == 'X') &&
                (uVar7 = (ulong)(pMVar9->ptr32 >> 0x10), -8 < (long)(lVar8 + uVar7 * 4))) &&
               (pMVar9 + (uVar7 - 0x7fff) <= endpc)) {
              return 0;
            }
            pMVar9 = pMVar9 + -1;
            lVar8 = lVar8 + -4;
          } while (pGVar1 < pMVar9);
        }
        if (uVar10 == 0x29) {
          k = (int)uVar2 >> 0x10;
          if (t == IRT_IGC) {
LAB_001452d0:
            TVar6 = lj_ir_kint(J,k);
            return TVar6;
          }
          dVar11 = (double)k;
        }
        else {
          uVar7 = (ulong)(J->pt->k).ptr32;
          if (t == IRT_IGC) {
            dVar11 = *(double *)(uVar7 + (ulong)(uVar2 >> 0x10) * 8);
            if (dVar11 != (double)(int)dVar11) {
              return 0;
            }
            if (NAN(dVar11) || NAN((double)(int)dVar11)) {
              return 0;
            }
            k = (int)dVar11;
            goto LAB_001452d0;
          }
          dVar11 = *(double *)(uVar7 + (ulong)(uVar2 >> 0x10) * 8);
        }
        TVar6 = lj_ir_knum_u64(J,(uint64_t)dVar11);
        return TVar6;
      }
    }
    else if (((lj_bc_mode[uVar10] & 7) == 2) && ((uVar2 >> 8 & 0xff) <= slot)) {
      return 0;
    }
    pGVar5 = (GCproto *)&pGVar3[-1].varinfo;
    pGVar4 = pGVar3;
  } while( true );
}

Assistant:

static TRef find_kinit(jit_State *J, const BCIns *endpc, BCReg slot, IRType t)
{
  /* This algorithm is rather simplistic and assumes quite a bit about
  ** how the bytecode is generated. It works fine for FORI initializers,
  ** but it won't necessarily work in other cases (e.g. iterator arguments).
  ** It doesn't do anything fancy, either (like backpropagating MOVs).
  */
  const BCIns *pc, *startpc = proto_bc(J->pt);
  for (pc = endpc-1; pc > startpc; pc--) {
    BCIns ins = *pc;
    BCOp op = bc_op(ins);
    /* First try to find the last instruction that stores to this slot. */
    if (bcmode_a(op) == BCMbase && bc_a(ins) <= slot) {
      return 0;  /* Multiple results, e.g. from a CALL or KNIL. */
    } else if (bcmode_a(op) == BCMdst && bc_a(ins) == slot) {
      if (op == BC_KSHORT || op == BC_KNUM) {  /* Found const. initializer. */
	/* Now try to verify there's no forward jump across it. */
	const BCIns *kpc = pc;
	for (; pc > startpc; pc--)
	  if (bc_op(*pc) == BC_JMP) {
	    const BCIns *target = pc+bc_j(*pc)+1;
	    if (target > kpc && target <= endpc)
	      return 0;  /* Conditional assignment. */
	  }
	if (op == BC_KSHORT) {
	  int32_t k = (int32_t)(int16_t)bc_d(ins);
	  return t == IRT_INT ? lj_ir_kint(J, k) : lj_ir_knum(J, (lua_Number)k);
	} else {
	  cTValue *tv = proto_knumtv(J->pt, bc_d(ins));
	  if (t == IRT_INT) {
	    int32_t k = numberVint(tv);
	    if (tvisint(tv) || numV(tv) == (lua_Number)k)  /* -0 is ok here. */
	      return lj_ir_kint(J, k);
	    return 0;  /* Type mismatch. */
	  } else {
	    return lj_ir_knum(J, numberVnum(tv));
	  }
	}
      }
      return 0;  /* Non-constant initializer. */
    }
  }
  return 0;  /* No assignment to this slot found? */
}